

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O3

int32_t parse_slice_bfr(Btor2Parser *bfr,Btor2Line *l)

{
  int64_t *piVar1;
  int32_t iVar2;
  char *fmt;
  uint32_t lower;
  uint local_1c;
  
  iVar2 = parse_ext_bfr(bfr,l);
  if (iVar2 == 0) {
    return 0;
  }
  iVar2 = getc_bfr(bfr);
  if (iVar2 == 0x20) {
    iVar2 = parse_pos_number_bfr(bfr,&local_1c);
    if (iVar2 == 0) {
      return 0;
    }
    piVar1 = l->args;
    piVar1[2] = (ulong)local_1c;
    if ((long)(ulong)local_1c <= piVar1[1]) {
      return 1;
    }
    fmt = "lower has to be less than or equal to upper";
  }
  else {
    fmt = "expected space after second argument";
  }
  perr_bfr(bfr,fmt);
  return 0;
}

Assistant:

static int32_t
parse_slice_bfr (Btor2Parser *bfr, Btor2Line *l)
{
  uint32_t lower;
  if (!parse_ext_bfr (bfr, l)) return 0;
  if (getc_bfr (bfr) != ' ')
    return perr_bfr (bfr, "expected space after second argument");
  if (!parse_pos_number_bfr (bfr, &lower)) return 0;
  l->args[2] = lower;
  if (lower > l->args[1])
    return perr_bfr (bfr, "lower has to be less than or equal to upper");
  return 1;
}